

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QSsl::SslProtocol>::end(QList<QSsl::SslProtocol> *this)

{
  SslProtocol *n;
  QArrayDataPointer<QSsl::SslProtocol> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QSsl::SslProtocol> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QSsl::SslProtocol> *)0x12d579);
  QArrayDataPointer<QSsl::SslProtocol>::operator->(in_RDI);
  n = QArrayDataPointer<QSsl::SslProtocol>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }